

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolLastFlag(SUNLinearSolver S,int myid)

{
  long lVar1;
  
  lVar1 = SUNLinSolLastFlag(S);
  if (myid == 0) {
    printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n",lVar1);
    if (print_time != 0) {
      printf("    SUNLinSolLastFlag Time: %22.15e \n \n",0);
    }
  }
  return 0;
}

Assistant:

int Test_SUNLinSolLastFlag(SUNLinearSolver S, int myid)
{
  double   start_time, stop_time;
  long int lastflag;

  /* the only way to fail this test is if the function is NULL, 
     which will cause a seg-fault */
  start_time = get_time();   
  lastflag = SUNLinSolLastFlag(S);
  stop_time = get_time();   

  if (myid == 0) {
    printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n", lastflag);
    PRINT_TIME("    SUNLinSolLastFlag Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}